

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void rhash_sha256_process_block(uint *hash,uint *block)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint local_100;
  uint local_fc;
  uint local_f8;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  uint local_dc;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_bc;
  
  uVar1 = *hash;
  uVar2 = hash[1];
  uVar3 = hash[2];
  uVar4 = hash[4];
  uVar5 = hash[5];
  uVar6 = hash[6];
  uVar13 = *block;
  uVar19 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar6 ^ uVar5) & uVar4 ^ uVar6) + hash[7] +
          ((uVar4 << 7 | uVar4 >> 0x19) ^
          (uVar4 << 0x15 | uVar4 >> 0xb) ^ (uVar4 << 0x1a | uVar4 >> 6));
  uVar18 = hash[3] + iVar8 + uVar19 + 0x428a2f98;
  uVar7 = ((uVar2 ^ uVar1) & uVar3 ^ uVar2 & uVar1) +
          ((uVar1 << 10 | uVar1 >> 0x16) ^
          (uVar1 << 0x13 | uVar1 >> 0xd) ^ (uVar1 << 0x1e | uVar1 >> 2)) +
          iVar8 + uVar19 + 0x428a2f98;
  uVar9 = (uVar18 * 0x80 | uVar18 >> 0x19) ^
          (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6);
  uVar13 = block[1];
  uVar15 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar5 ^ uVar4) & uVar18 ^ uVar5) + uVar15 + uVar6;
  uVar10 = ((uVar7 ^ uVar1) & uVar2 ^ uVar7 & uVar1) +
           ((uVar7 * 0x400 | uVar7 >> 0x16) ^
           (uVar7 * 0x80000 | uVar7 >> 0xd) ^ (uVar7 * 0x40000000 | uVar7 >> 2)) +
           iVar8 + uVar9 + 0x71374491;
  uVar20 = uVar3 + iVar8 + uVar9 + 0x71374491;
  uVar9 = (uVar20 * 0x80 | uVar20 >> 0x19) ^
          (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6);
  uVar13 = block[2];
  uVar14 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar18 ^ uVar4) & uVar20 ^ uVar4) + uVar5 + uVar14;
  uVar11 = ((uVar10 ^ uVar7) & uVar1 ^ uVar10 & uVar7) +
           ((uVar10 * 0x400 | uVar10 >> 0x16) ^
           (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) +
           iVar8 + uVar9 + -0x4a3f0431;
  uVar12 = uVar2 + iVar8 + uVar9 + 0xb5c0fbcf;
  uVar16 = (uVar12 * 0x80 | uVar12 >> 0x19) ^
           (uVar12 * 0x200000 | uVar12 >> 0xb) ^ (uVar12 * 0x4000000 | uVar12 >> 6);
  uVar13 = block[3];
  uVar9 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar20 ^ uVar18) & uVar12 ^ uVar18) + uVar4 + uVar9;
  uVar23 = iVar8 + uVar16 + uVar1 + 0xe9b5dba5;
  uVar17 = ((uVar11 ^ uVar10) & uVar7 ^ uVar11 & uVar10) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) +
           iVar8 + uVar16 + -0x164a245b;
  uVar13 = block[4];
  local_d0 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = uVar18 + local_d0 + ((uVar12 ^ uVar20) & uVar23 ^ uVar20) +
          ((uVar23 * 0x80 | uVar23 >> 0x19) ^
          (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) + 0x3956c25b;
  uVar7 = uVar7 + iVar8;
  uVar22 = ((uVar17 ^ uVar11) & uVar10 ^ uVar17 & uVar11) +
           ((uVar17 * 0x400 | uVar17 >> 0x16) ^
           (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar8;
  uVar13 = block[5];
  local_d4 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = uVar20 + local_d4 + ((uVar23 ^ uVar12) & uVar7 ^ uVar12) +
          ((uVar7 * 0x80 | uVar7 >> 0x19) ^
          (uVar7 * 0x200000 | uVar7 >> 0xb) ^ (uVar7 * 0x4000000 | uVar7 >> 6)) + 0x59f111f1;
  uVar10 = uVar10 + iVar8;
  uVar16 = ((uVar22 ^ uVar17) & uVar11 ^ uVar22 & uVar17) +
           ((uVar22 * 0x400 | uVar22 >> 0x16) ^
           (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
  uVar13 = block[6];
  local_dc = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar10 * 0x80 | uVar10 >> 0x19) ^
          (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6)) +
          uVar12 + local_dc + ((uVar7 ^ uVar23) & uVar10 ^ uVar23) + -0x6dc07d5c;
  uVar11 = uVar11 + iVar8;
  uVar18 = ((uVar16 ^ uVar22) & uVar17 ^ uVar16 & uVar22) +
           ((uVar16 * 0x400 | uVar16 >> 0x16) ^
           (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
  uVar13 = block[7];
  local_bc = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar23 + local_bc + ((uVar10 ^ uVar7) & uVar11 ^ uVar7) + -0x54e3a12b;
  uVar17 = uVar17 + iVar8;
  uVar20 = ((uVar18 ^ uVar16) & uVar22 ^ uVar18 & uVar16) +
           ((uVar18 * 0x400 | uVar18 >> 0x16) ^
           (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar8;
  uVar13 = block[8];
  local_cc = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = uVar7 + local_cc + ((uVar11 ^ uVar10) & uVar17 ^ uVar10) +
          ((uVar17 * 0x80 | uVar17 >> 0x19) ^
          (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6)) + -0x27f85568;
  uVar22 = uVar22 + iVar8;
  uVar23 = ((uVar20 ^ uVar18) & uVar16 ^ uVar20 & uVar18) +
           ((uVar20 * 0x400 | uVar20 >> 0x16) ^
           (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
  uVar13 = block[9];
  uVar12 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = uVar10 + uVar12 + ((uVar17 ^ uVar11) & uVar22 ^ uVar11) +
          ((uVar22 * 0x80 | uVar22 >> 0x19) ^
          (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6)) + 0x12835b01;
  uVar16 = uVar16 + iVar8;
  uVar25 = ((uVar23 ^ uVar20) & uVar18 ^ uVar23 & uVar20) +
           ((uVar23 * 0x400 | uVar23 >> 0x16) ^
           (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
  uVar13 = block[10];
  local_f4 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar16 * 0x80 | uVar16 >> 0x19) ^
          (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6)) +
          uVar11 + local_f4 + ((uVar22 ^ uVar17) & uVar16 ^ uVar17) + 0x243185be;
  uVar18 = uVar18 + iVar8;
  uVar11 = ((uVar25 ^ uVar23) & uVar20 ^ uVar25 & uVar23) +
           ((uVar25 * 0x400 | uVar25 >> 0x16) ^
           (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar8;
  uVar13 = block[0xb];
  local_f8 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar18 * 0x80 | uVar18 >> 0x19) ^
          (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6)) +
          uVar17 + local_f8 + ((uVar16 ^ uVar22) & uVar18 ^ uVar22) + 0x550c7dc3;
  uVar20 = uVar20 + iVar8;
  uVar24 = ((uVar11 ^ uVar25) & uVar23 ^ uVar11 & uVar25) +
           ((uVar11 * 0x400 | uVar11 >> 0x16) ^
           (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
  uVar13 = block[0xc];
  local_fc = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar20 * 0x80 | uVar20 >> 0x19) ^
          (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6)) +
          uVar22 + local_fc + ((uVar18 ^ uVar16) & uVar20 ^ uVar16) + 0x72be5d74;
  uVar23 = uVar23 + iVar8;
  uVar17 = ((uVar24 ^ uVar11) & uVar25 ^ uVar24 & uVar11) +
           ((uVar24 * 0x400 | uVar24 >> 0x16) ^
           (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
  uVar13 = block[0xd];
  local_100 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar23 * 0x80 | uVar23 >> 0x19) ^
          (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6)) +
          uVar16 + local_100 + ((uVar20 ^ uVar18) & uVar23 ^ uVar18) + -0x7f214e02;
  uVar25 = uVar25 + iVar8;
  uVar10 = ((uVar17 ^ uVar24) & uVar11 ^ uVar17 & uVar24) +
           ((uVar17 * 0x400 | uVar17 >> 0x16) ^
           (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar8;
  uVar13 = block[0xe];
  uVar7 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar25 * 0x80 | uVar25 >> 0x19) ^
          (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6)) +
          uVar18 + uVar7 + ((uVar23 ^ uVar20) & uVar25 ^ uVar20) + -0x6423f959;
  uVar11 = uVar11 + iVar8;
  local_ec = ((uVar10 ^ uVar17) & uVar24 ^ uVar10 & uVar17) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
  uVar13 = block[0xf];
  local_f0 = uVar13 >> 0x18 | (uVar13 & 0xff0000) >> 8 | (uVar13 & 0xff00) << 8 | uVar13 << 0x18;
  iVar8 = ((uVar11 * 0x80 | uVar11 >> 0x19) ^
          (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6)) +
          uVar20 + local_f0 + ((uVar25 ^ uVar23) & uVar11 ^ uVar23) + -0x3e640e8c;
  uVar24 = uVar24 + iVar8;
  uVar13 = ((local_ec ^ uVar10) & uVar17 ^ local_ec & uVar10) +
           ((local_ec * 0x400 | local_ec >> 0x16) ^
           (local_ec * 0x80000 | local_ec >> 0xd) ^ (local_ec * 0x40000000 | local_ec >> 2)) + iVar8
  ;
  for (lVar21 = 0x10; (uint)lVar21 < 0x40; lVar21 = lVar21 + 0x10) {
    uVar19 = uVar19 + uVar12 +
             (uVar15 >> 3 ^ (uVar15 << 0xe | uVar15 >> 0x12) ^ (uVar15 << 0x19 | uVar15 >> 7)) +
             (uVar7 >> 10 ^ (uVar7 << 0xd | uVar7 >> 0x13) ^ (uVar7 << 0xf | uVar7 >> 0x11));
    iVar8 = uVar23 + ((uVar11 ^ uVar25) & uVar24 ^ uVar25) +
            ((uVar24 << 7 | uVar24 >> 0x19) ^
            (uVar24 << 0x15 | uVar24 >> 0xb) ^ (uVar24 << 0x1a | uVar24 >> 6)) + uVar19 +
            rhash_k256[lVar21];
    uVar17 = uVar17 + iVar8;
    uVar23 = ((uVar13 ^ local_ec) & uVar10 ^ uVar13 & local_ec) +
             ((uVar13 << 10 | uVar13 >> 0x16) ^
             (uVar13 << 0x13 | uVar13 >> 0xd) ^ (uVar13 << 0x1e | uVar13 >> 2)) + iVar8;
    uVar15 = uVar15 + local_f4 +
             (uVar14 >> 3 ^ (uVar14 << 0xe | uVar14 >> 0x12) ^ (uVar14 << 0x19 | uVar14 >> 7)) +
             (local_f0 >> 10 ^
             (local_f0 << 0xd | local_f0 >> 0x13) ^ (local_f0 << 0xf | local_f0 >> 0x11));
    iVar8 = uVar25 + uVar15 + rhash_k256[lVar21 + 1] + ((uVar24 ^ uVar11) & uVar17 ^ uVar11) +
            ((uVar17 * 0x80 | uVar17 >> 0x19) ^
            (uVar17 * 0x200000 | uVar17 >> 0xb) ^ (uVar17 * 0x4000000 | uVar17 >> 6));
    uVar10 = uVar10 + iVar8;
    uVar18 = ((uVar23 ^ uVar13) & local_ec ^ uVar23 & uVar13) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    uVar14 = uVar14 + local_f8 +
             (uVar9 >> 3 ^ (uVar9 << 0xe | uVar9 >> 0x12) ^ (uVar9 << 0x19 | uVar9 >> 7)) +
             (uVar19 >> 10 ^ (uVar19 * 0x2000 | uVar19 >> 0x13) ^ (uVar19 * 0x8000 | uVar19 >> 0x11)
             );
    iVar8 = uVar11 + uVar14 + rhash_k256[lVar21 + 2] + ((uVar17 ^ uVar24) & uVar10 ^ uVar24) +
            ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    local_ec = local_ec + iVar8;
    uVar11 = ((uVar18 ^ uVar23) & uVar13 ^ uVar18 & uVar23) +
             ((uVar18 * 0x400 | uVar18 >> 0x16) ^
             (uVar18 * 0x80000 | uVar18 >> 0xd) ^ (uVar18 * 0x40000000 | uVar18 >> 2)) + iVar8;
    uVar9 = uVar9 + local_fc +
            (local_d0 >> 3 ^
            (local_d0 << 0xe | local_d0 >> 0x12) ^ (local_d0 << 0x19 | local_d0 >> 7)) +
            (uVar15 >> 10 ^ (uVar15 * 0x2000 | uVar15 >> 0x13) ^ (uVar15 * 0x8000 | uVar15 >> 0x11))
    ;
    iVar8 = uVar24 + uVar9 + rhash_k256[lVar21 + 3] + ((uVar10 ^ uVar17) & local_ec ^ uVar17) +
            ((local_ec * 0x80 | local_ec >> 0x19) ^
            (local_ec * 0x200000 | local_ec >> 0xb) ^ (local_ec * 0x4000000 | local_ec >> 6));
    uVar13 = uVar13 + iVar8;
    uVar20 = ((uVar11 ^ uVar18) & uVar23 ^ uVar11 & uVar18) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
    local_d0 = local_d0 + local_100 +
               (local_d4 >> 3 ^
               (local_d4 << 0xe | local_d4 >> 0x12) ^ (local_d4 << 0x19 | local_d4 >> 7)) +
               (uVar14 >> 10 ^
               (uVar14 * 0x2000 | uVar14 >> 0x13) ^ (uVar14 * 0x8000 | uVar14 >> 0x11));
    iVar8 = uVar17 + local_d0 + rhash_k256[lVar21 + 4] + ((local_ec ^ uVar10) & uVar13 ^ uVar10) +
            ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    uVar23 = uVar23 + iVar8;
    uVar16 = ((uVar20 ^ uVar11) & uVar18 ^ uVar20 & uVar11) +
             ((uVar20 * 0x400 | uVar20 >> 0x16) ^
             (uVar20 * 0x80000 | uVar20 >> 0xd) ^ (uVar20 * 0x40000000 | uVar20 >> 2)) + iVar8;
    local_d4 = local_d4 + uVar7 +
               (local_dc >> 3 ^
               (local_dc << 0xe | local_dc >> 0x12) ^ (local_dc << 0x19 | local_dc >> 7)) +
               (uVar9 >> 10 ^ (uVar9 * 0x2000 | uVar9 >> 0x13) ^ (uVar9 * 0x8000 | uVar9 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 5] + local_d4 + uVar10 + ((uVar13 ^ local_ec) & uVar23 ^ local_ec) +
            ((uVar23 * 0x80 | uVar23 >> 0x19) ^
            (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar18 = uVar18 + iVar8;
    uVar10 = ((uVar16 ^ uVar20) & uVar11 ^ uVar16 & uVar20) +
             ((uVar16 * 0x400 | uVar16 >> 0x16) ^
             (uVar16 * 0x80000 | uVar16 >> 0xd) ^ (uVar16 * 0x40000000 | uVar16 >> 2)) + iVar8;
    local_dc = local_dc + local_f0 +
               (local_bc >> 3 ^
               (local_bc << 0xe | local_bc >> 0x12) ^ (local_bc << 0x19 | local_bc >> 7)) +
               (local_d0 >> 10 ^
               (local_d0 * 0x2000 | local_d0 >> 0x13) ^ (local_d0 * 0x8000 | local_d0 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 6] + local_dc + local_ec + ((uVar23 ^ uVar13) & uVar18 ^ uVar13) +
            ((uVar18 * 0x80 | uVar18 >> 0x19) ^
            (uVar18 * 0x200000 | uVar18 >> 0xb) ^ (uVar18 * 0x4000000 | uVar18 >> 6));
    uVar11 = uVar11 + iVar8;
    uVar22 = ((uVar10 ^ uVar16) & uVar20 ^ uVar10 & uVar16) +
             ((uVar10 * 0x400 | uVar10 >> 0x16) ^
             (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    local_bc = (local_cc >> 3 ^
               (local_cc << 0xe | local_cc >> 0x12) ^ (local_cc << 0x19 | local_cc >> 7)) + local_bc
               + uVar19 +
               (local_d4 >> 10 ^
               (local_d4 * 0x2000 | local_d4 >> 0x13) ^ (local_d4 * 0x8000 | local_d4 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 7] + local_bc + uVar13 + ((uVar18 ^ uVar23) & uVar11 ^ uVar23) +
            ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar20 = uVar20 + iVar8;
    uVar13 = ((uVar22 ^ uVar10) & uVar16 ^ uVar22 & uVar10) +
             ((uVar22 * 0x400 | uVar22 >> 0x16) ^
             (uVar22 * 0x80000 | uVar22 >> 0xd) ^ (uVar22 * 0x40000000 | uVar22 >> 2)) + iVar8;
    local_cc = (uVar12 >> 3 ^ (uVar12 << 0xe | uVar12 >> 0x12) ^ (uVar12 << 0x19 | uVar12 >> 7)) +
               local_cc + uVar15 +
               (local_dc >> 10 ^
               (local_dc * 0x2000 | local_dc >> 0x13) ^ (local_dc * 0x8000 | local_dc >> 0x11));
    iVar8 = rhash_k256[lVar21 + 8] + local_cc + uVar23 + ((uVar11 ^ uVar18) & uVar20 ^ uVar18) +
            ((uVar20 * 0x80 | uVar20 >> 0x19) ^
            (uVar20 * 0x200000 | uVar20 >> 0xb) ^ (uVar20 * 0x4000000 | uVar20 >> 6));
    uVar16 = uVar16 + iVar8;
    uVar23 = ((uVar13 ^ uVar22) & uVar10 ^ uVar13 & uVar22) +
             ((uVar13 * 0x400 | uVar13 >> 0x16) ^
             (uVar13 * 0x80000 | uVar13 >> 0xd) ^ (uVar13 * 0x40000000 | uVar13 >> 2)) + iVar8;
    uVar12 = (local_f4 >> 3 ^
             (local_f4 << 0xe | local_f4 >> 0x12) ^ (local_f4 << 0x19 | local_f4 >> 7)) + uVar12 +
             uVar14 + (local_bc >> 10 ^
                      (local_bc * 0x2000 | local_bc >> 0x13) ^
                      (local_bc * 0x8000 | local_bc >> 0x11));
    iVar8 = rhash_k256[lVar21 + 9] + uVar12 + uVar18 + ((uVar20 ^ uVar11) & uVar16 ^ uVar11) +
            ((uVar16 * 0x80 | uVar16 >> 0x19) ^
            (uVar16 * 0x200000 | uVar16 >> 0xb) ^ (uVar16 * 0x4000000 | uVar16 >> 6));
    uVar10 = uVar10 + iVar8;
    uVar25 = ((uVar23 ^ uVar13) & uVar22 ^ uVar23 & uVar13) +
             ((uVar23 * 0x400 | uVar23 >> 0x16) ^
             (uVar23 * 0x80000 | uVar23 >> 0xd) ^ (uVar23 * 0x40000000 | uVar23 >> 2)) + iVar8;
    local_f4 = (local_f8 >> 3 ^
               (local_f8 << 0xe | local_f8 >> 0x12) ^ (local_f8 << 0x19 | local_f8 >> 7)) + local_f4
               + uVar9 + (local_cc >> 10 ^
                         (local_cc * 0x2000 | local_cc >> 0x13) ^
                         (local_cc * 0x8000 | local_cc >> 0x11));
    iVar8 = rhash_k256[lVar21 + 10] + local_f4 + uVar11 + ((uVar16 ^ uVar20) & uVar10 ^ uVar20) +
            ((uVar10 * 0x80 | uVar10 >> 0x19) ^
            (uVar10 * 0x200000 | uVar10 >> 0xb) ^ (uVar10 * 0x4000000 | uVar10 >> 6));
    uVar22 = uVar22 + iVar8;
    uVar11 = ((uVar25 ^ uVar23) & uVar13 ^ uVar25 & uVar23) +
             ((uVar25 * 0x400 | uVar25 >> 0x16) ^
             (uVar25 * 0x80000 | uVar25 >> 0xd) ^ (uVar25 * 0x40000000 | uVar25 >> 2)) + iVar8;
    local_f8 = (local_fc >> 3 ^
               (local_fc << 0xe | local_fc >> 0x12) ^ (local_fc << 0x19 | local_fc >> 7)) + local_f8
               + local_d0 +
               (uVar12 >> 10 ^
               (uVar12 * 0x2000 | uVar12 >> 0x13) ^ (uVar12 * 0x8000 | uVar12 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 0xb] + local_f8 + uVar20 + ((uVar10 ^ uVar16) & uVar22 ^ uVar16) +
            ((uVar22 * 0x80 | uVar22 >> 0x19) ^
            (uVar22 * 0x200000 | uVar22 >> 0xb) ^ (uVar22 * 0x4000000 | uVar22 >> 6));
    uVar13 = uVar13 + iVar8;
    uVar24 = ((uVar11 ^ uVar25) & uVar23 ^ uVar11 & uVar25) +
             ((uVar11 * 0x400 | uVar11 >> 0x16) ^
             (uVar11 * 0x80000 | uVar11 >> 0xd) ^ (uVar11 * 0x40000000 | uVar11 >> 2)) + iVar8;
    local_fc = (local_100 >> 3 ^
               (local_100 << 0xe | local_100 >> 0x12) ^ (local_100 << 0x19 | local_100 >> 7)) +
               local_fc + local_d4 +
               (local_f4 >> 10 ^
               (local_f4 * 0x2000 | local_f4 >> 0x13) ^ (local_f4 * 0x8000 | local_f4 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 0xc] + local_fc + uVar16 + ((uVar22 ^ uVar10) & uVar13 ^ uVar10) +
            ((uVar13 * 0x80 | uVar13 >> 0x19) ^
            (uVar13 * 0x200000 | uVar13 >> 0xb) ^ (uVar13 * 0x4000000 | uVar13 >> 6));
    uVar23 = uVar23 + iVar8;
    uVar17 = ((uVar24 ^ uVar11) & uVar25 ^ uVar24 & uVar11) +
             ((uVar24 * 0x400 | uVar24 >> 0x16) ^
             (uVar24 * 0x80000 | uVar24 >> 0xd) ^ (uVar24 * 0x40000000 | uVar24 >> 2)) + iVar8;
    local_100 = (uVar7 >> 3 ^ (uVar7 << 0xe | uVar7 >> 0x12) ^ (uVar7 << 0x19 | uVar7 >> 7)) +
                local_100 + local_dc +
                (local_f8 >> 10 ^
                (local_f8 * 0x2000 | local_f8 >> 0x13) ^ (local_f8 * 0x8000 | local_f8 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 0xd] + local_100 + uVar10 + ((uVar13 ^ uVar22) & uVar23 ^ uVar22) +
            ((uVar23 * 0x80 | uVar23 >> 0x19) ^
            (uVar23 * 0x200000 | uVar23 >> 0xb) ^ (uVar23 * 0x4000000 | uVar23 >> 6));
    uVar25 = uVar25 + iVar8;
    uVar10 = ((uVar17 ^ uVar24) & uVar11 ^ uVar17 & uVar24) +
             ((uVar17 * 0x400 | uVar17 >> 0x16) ^
             (uVar17 * 0x80000 | uVar17 >> 0xd) ^ (uVar17 * 0x40000000 | uVar17 >> 2)) + iVar8;
    uVar7 = (local_f0 >> 3 ^
            (local_f0 << 0xe | local_f0 >> 0x12) ^ (local_f0 << 0x19 | local_f0 >> 7)) + uVar7 +
            local_bc +
            (local_fc >> 10 ^
            (local_fc * 0x2000 | local_fc >> 0x13) ^ (local_fc * 0x8000 | local_fc >> 0x11));
    iVar8 = rhash_k256[lVar21 + 0xe] + uVar7 + uVar22 + ((uVar23 ^ uVar13) & uVar25 ^ uVar13) +
            ((uVar25 * 0x80 | uVar25 >> 0x19) ^
            (uVar25 * 0x200000 | uVar25 >> 0xb) ^ (uVar25 * 0x4000000 | uVar25 >> 6));
    uVar11 = uVar11 + iVar8;
    local_ec = ((uVar10 ^ uVar17) & uVar24 ^ uVar10 & uVar17) +
               ((uVar10 * 0x400 | uVar10 >> 0x16) ^
               (uVar10 * 0x80000 | uVar10 >> 0xd) ^ (uVar10 * 0x40000000 | uVar10 >> 2)) + iVar8;
    local_f0 = (uVar19 >> 3 ^
               (uVar19 * 0x4000 | uVar19 >> 0x12) ^ (uVar19 * 0x2000000 | uVar19 >> 7)) + local_f0 +
               local_cc +
               (local_100 >> 10 ^
               (local_100 * 0x2000 | local_100 >> 0x13) ^ (local_100 * 0x8000 | local_100 >> 0x11));
    iVar8 = rhash_k256[lVar21 + 0xf] + local_f0 + uVar13 + ((uVar25 ^ uVar23) & uVar11 ^ uVar23) +
            ((uVar11 * 0x80 | uVar11 >> 0x19) ^
            (uVar11 * 0x200000 | uVar11 >> 0xb) ^ (uVar11 * 0x4000000 | uVar11 >> 6));
    uVar24 = uVar24 + iVar8;
    uVar13 = ((local_ec ^ uVar10) & uVar17 ^ local_ec & uVar10) +
             ((local_ec * 0x400 | local_ec >> 0x16) ^
             (local_ec * 0x80000 | local_ec >> 0xd) ^ (local_ec * 0x40000000 | local_ec >> 2)) +
             iVar8;
  }
  *hash = uVar13 + uVar1;
  hash[1] = local_ec + uVar2;
  hash[2] = uVar10 + uVar3;
  hash[3] = uVar17 + hash[3];
  hash[4] = uVar24 + uVar4;
  hash[5] = uVar11 + uVar5;
  hash[6] = uVar25 + uVar6;
  hash[7] = uVar23 + hash[7];
  return;
}

Assistant:

static void rhash_sha256_process_block(unsigned hash[8], unsigned block[16])
{
	unsigned A, B, C, D, E, F, G, H;
	unsigned W[16];
	const unsigned* k;
	int i;

	A = hash[0], B = hash[1], C = hash[2], D = hash[3];
	E = hash[4], F = hash[5], G = hash[6], H = hash[7];

	/* Compute SHA using alternate Method: FIPS 180-3 6.1.3 */
	ROUND_1_16(A, B, C, D, E, F, G, H, 0);
	ROUND_1_16(H, A, B, C, D, E, F, G, 1);
	ROUND_1_16(G, H, A, B, C, D, E, F, 2);
	ROUND_1_16(F, G, H, A, B, C, D, E, 3);
	ROUND_1_16(E, F, G, H, A, B, C, D, 4);
	ROUND_1_16(D, E, F, G, H, A, B, C, 5);
	ROUND_1_16(C, D, E, F, G, H, A, B, 6);
	ROUND_1_16(B, C, D, E, F, G, H, A, 7);
	ROUND_1_16(A, B, C, D, E, F, G, H, 8);
	ROUND_1_16(H, A, B, C, D, E, F, G, 9);
	ROUND_1_16(G, H, A, B, C, D, E, F, 10);
	ROUND_1_16(F, G, H, A, B, C, D, E, 11);
	ROUND_1_16(E, F, G, H, A, B, C, D, 12);
	ROUND_1_16(D, E, F, G, H, A, B, C, 13);
	ROUND_1_16(C, D, E, F, G, H, A, B, 14);
	ROUND_1_16(B, C, D, E, F, G, H, A, 15);

	for (i = 16, k = &rhash_k256[16]; i < 64; i += 16, k += 16) {
		ROUND_17_64(A, B, C, D, E, F, G, H,  0);
		ROUND_17_64(H, A, B, C, D, E, F, G,  1);
		ROUND_17_64(G, H, A, B, C, D, E, F,  2);
		ROUND_17_64(F, G, H, A, B, C, D, E,  3);
		ROUND_17_64(E, F, G, H, A, B, C, D,  4);
		ROUND_17_64(D, E, F, G, H, A, B, C,  5);
		ROUND_17_64(C, D, E, F, G, H, A, B,  6);
		ROUND_17_64(B, C, D, E, F, G, H, A,  7);
		ROUND_17_64(A, B, C, D, E, F, G, H,  8);
		ROUND_17_64(H, A, B, C, D, E, F, G,  9);
		ROUND_17_64(G, H, A, B, C, D, E, F, 10);
		ROUND_17_64(F, G, H, A, B, C, D, E, 11);
		ROUND_17_64(E, F, G, H, A, B, C, D, 12);
		ROUND_17_64(D, E, F, G, H, A, B, C, 13);
		ROUND_17_64(C, D, E, F, G, H, A, B, 14);
		ROUND_17_64(B, C, D, E, F, G, H, A, 15);
	}

	hash[0] += A, hash[1] += B, hash[2] += C, hash[3] += D;
	hash[4] += E, hash[5] += F, hash[6] += G, hash[7] += H;
}